

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IdentifierSelectNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IdentifierSelectNameSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ElementSelectSyntax>&>
          (BumpAllocator *this,Token *args,SyntaxList<slang::syntax::ElementSelectSyntax> *args_1)

{
  Token identifier;
  IdentifierSelectNameSyntax *pIVar1;
  SyntaxList<slang::syntax::ElementSelectSyntax> *in_RDX;
  IdentifierSelectNameSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pIVar1 = (IdentifierSelectNameSyntax *)
           allocate((BumpAllocator *)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  identifier.info = unaff_retaddr;
  identifier.kind = (short)in_RDI;
  identifier._2_1_ = (char)((ulong)in_RDI >> 0x10);
  identifier.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  identifier.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::IdentifierSelectNameSyntax::IdentifierSelectNameSyntax(in_RSI,identifier,in_RDX);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }